

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

str_t * get_sys_temp_dir(str_t *sys_temp_dir)

{
  char *pcVar1;
  
  if (sys_temp_dir == (str_t *)0x0) {
    sys_temp_dir = (str_t *)0x0;
  }
  else {
    pcVar1 = getenv("TMPDIR");
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      pcVar1 = strdup("/tmp");
      sys_temp_dir->name = pcVar1;
      sys_temp_dir->size = 5;
    }
    else {
      get_sys_temp_dir_cold_1();
    }
  }
  return sys_temp_dir;
}

Assistant:

str_t *
get_sys_temp_dir (str_t *sys_temp_dir)
{
  if (unlikely (sys_temp_dir == NULL))
    return NULL;

#ifdef WINDOWS
    {
      wchar_t w_tmp[MAX_PATH];
      char *tmp;
      size_t len = GetTempPathW (MAX_PATH, w_tmp);
      assert (0 < len);

      sys_temp_dir->name = wide_char_to_multibyte (w_tmp, len, &sys_temp_dir->size);

      return sys_temp_dir;
    }
#else
    {
      char* s = getenv ("TMPDIR");
      if (s && *s)
        {
          int len = strlen (s);

          if (s[len - 1] == DIR_SEPARATOR)
            {
              sys_temp_dir->name = strndup (s, len - 1);
              sys_temp_dir->size = len; /* len - 1 (last char) + 1 (terminating 0 byte)*/
            }
          else
            {
              sys_temp_dir->name = strndup (s, len);
              sys_temp_dir->size = len + 1 /* + 1 (terminating 0 byte)*/;
            }
          elog_debug ("%s: name: (%s)\n", __func__, sys_temp_dir->name);
          elog_debug ("%s: size: (%lu)\n", __func__, sys_temp_dir->size);

          return sys_temp_dir;
      }
    }

  /* Fallback */
  sys_temp_dir->name = strdup ("/tmp");
  sys_temp_dir->size = sizeof ("/tmp");

  return sys_temp_dir;
#endif
}